

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  Geometry *pGVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  RTCIntersectArguments *pRVar22;
  RTCRayQueryContext *pRVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  ulong uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  byte bVar45;
  byte bVar46;
  uint uVar47;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar48) [32];
  long lVar49;
  ulong uVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  bool bVar65;
  ulong uVar66;
  float fVar67;
  float fVar102;
  float fVar103;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar104;
  undefined1 auVar73 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined8 uVar126;
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 in_XMM27 [16];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_27c8;
  ulong *local_27b0;
  undefined1 local_27a1;
  RayHit *local_27a0;
  ulong local_2798;
  uint local_2790;
  uint local_278c;
  uint local_2788;
  int local_2784;
  RayQueryContext *local_2780;
  ulong local_2778;
  long local_2770;
  long local_2768;
  ulong local_2760;
  ulong local_2758;
  ulong local_2750;
  ulong local_2748;
  ulong local_2740;
  ulong local_2738;
  ulong local_2730;
  long local_2728;
  long local_2720;
  long local_2718;
  Scene *local_2710;
  ulong local_2708;
  RTCFilterFunctionNArguments local_2700;
  float local_26d0;
  float local_26cc;
  float local_26c8;
  undefined4 local_26c4;
  undefined4 local_26c0;
  undefined4 local_26bc;
  undefined4 local_26b8;
  uint local_26b4;
  uint local_26b0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 *local_2600;
  byte local_25f8;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  uint uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  uint uStack_2544;
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  uint uStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar70 [16];
  undefined1 auVar78 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27b0 = local_2390;
    local_2398[0] = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar73 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar117 = (ray->super_RayK<1>).tfar;
    auVar111 = ZEXT464((uint)fVar117);
    auVar68._8_4_ = 0x7fffffff;
    auVar68._0_8_ = 0x7fffffff7fffffff;
    auVar68._12_4_ = 0x7fffffff;
    auVar68 = vandps_avx512vl((undefined1  [16])aVar4,auVar68);
    auVar69._8_4_ = 0x219392ef;
    auVar69._0_8_ = 0x219392ef219392ef;
    auVar69._12_4_ = 0x219392ef;
    uVar57 = vcmpps_avx512vl(auVar68,auVar69,1);
    auVar71._8_4_ = 0x3f800000;
    auVar71._0_8_ = 0x3f8000003f800000;
    auVar71._12_4_ = 0x3f800000;
    auVar68 = vdivps_avx(auVar71,(undefined1  [16])aVar4);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar65 = (bool)((byte)uVar57 & 1);
    auVar70._0_4_ = (uint)bVar65 * auVar69._0_4_ | (uint)!bVar65 * auVar68._0_4_;
    bVar65 = (bool)((byte)(uVar57 >> 1) & 1);
    auVar70._4_4_ = (uint)bVar65 * auVar69._4_4_ | (uint)!bVar65 * auVar68._4_4_;
    bVar65 = (bool)((byte)(uVar57 >> 2) & 1);
    auVar70._8_4_ = (uint)bVar65 * auVar69._8_4_ | (uint)!bVar65 * auVar68._8_4_;
    bVar65 = (bool)((byte)(uVar57 >> 3) & 1);
    auVar70._12_4_ = (uint)bVar65 * auVar69._12_4_ | (uint)!bVar65 * auVar68._12_4_;
    auVar29._8_4_ = 0x3f7ffffa;
    auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar29._12_4_ = 0x3f7ffffa;
    auVar71 = vmulps_avx512vl(auVar70,auVar29);
    auVar72._8_4_ = 0x3f800003;
    auVar72._0_8_ = 0x3f8000033f800003;
    auVar72._12_4_ = 0x3f800003;
    auVar72 = vmulps_avx512vl(auVar70,auVar72);
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2400._4_4_ = uVar2;
    local_2400._0_4_ = uVar2;
    local_2400._8_4_ = uVar2;
    local_2400._12_4_ = uVar2;
    local_2400._16_4_ = uVar2;
    local_2400._20_4_ = uVar2;
    local_2400._24_4_ = uVar2;
    local_2400._28_4_ = uVar2;
    auVar135 = ZEXT3264(local_2400);
    auVar68 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar117));
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2420._4_4_ = uVar2;
    local_2420._0_4_ = uVar2;
    local_2420._8_4_ = uVar2;
    local_2420._12_4_ = uVar2;
    local_2420._16_4_ = uVar2;
    local_2420._20_4_ = uVar2;
    local_2420._24_4_ = uVar2;
    local_2420._28_4_ = uVar2;
    auVar137 = ZEXT3264(local_2420);
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2440._4_4_ = uVar2;
    local_2440._0_4_ = uVar2;
    local_2440._8_4_ = uVar2;
    local_2440._12_4_ = uVar2;
    local_2440._16_4_ = uVar2;
    local_2440._20_4_ = uVar2;
    local_2440._24_4_ = uVar2;
    local_2440._28_4_ = uVar2;
    auVar140 = ZEXT3264(local_2440);
    fVar117 = auVar71._0_4_;
    local_2520._4_4_ = fVar117;
    local_2520._0_4_ = fVar117;
    local_2520._8_4_ = fVar117;
    local_2520._12_4_ = fVar117;
    local_2520._16_4_ = fVar117;
    local_2520._20_4_ = fVar117;
    local_2520._24_4_ = fVar117;
    local_2520._28_4_ = fVar117;
    auVar69 = vmovshdup_avx(auVar71);
    uVar126 = auVar69._0_8_;
    local_2460._8_8_ = uVar126;
    local_2460._0_8_ = uVar126;
    local_2460._16_8_ = uVar126;
    local_2460._24_8_ = uVar126;
    auVar143 = ZEXT3264(local_2460);
    auVar29 = vshufpd_avx(auVar71,auVar71,1);
    auVar75._8_4_ = 2;
    auVar75._0_8_ = 0x200000002;
    auVar75._12_4_ = 2;
    auVar75._16_4_ = 2;
    auVar75._20_4_ = 2;
    auVar75._24_4_ = 2;
    auVar75._28_4_ = 2;
    local_2480 = vpermps_avx512vl(auVar75,ZEXT1632(auVar71));
    auVar144 = ZEXT3264(local_2480);
    local_24a0 = vbroadcastss_avx512vl(auVar72);
    auVar145 = ZEXT3264(local_24a0);
    auVar74._8_4_ = 1;
    auVar74._0_8_ = 0x100000001;
    auVar74._12_4_ = 1;
    auVar74._16_4_ = 1;
    auVar74._20_4_ = 1;
    auVar74._24_4_ = 1;
    auVar74._28_4_ = 1;
    local_24c0 = vpermps_avx512vl(auVar74,ZEXT1632(auVar72));
    auVar146 = ZEXT3264(local_24c0);
    local_24e0 = vpermps_avx512vl(auVar75,ZEXT1632(auVar72));
    auVar147 = ZEXT3264(local_24e0);
    uVar50 = (ulong)(fVar117 < 0.0) << 5;
    uVar59 = (ulong)(auVar69._0_4_ < 0.0) << 5 | 0x40;
    auVar128 = ZEXT3264(local_2520);
    uVar60 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
    uVar61 = uVar50 ^ 0x20;
    uVar62 = uVar59 ^ 0x20;
    uVar57 = uVar60 ^ 0x20;
    local_2500 = vbroadcastss_avx512vl(auVar73);
    auVar148 = ZEXT3264(local_2500);
    auVar74 = vbroadcastss_avx512vl(auVar68);
    auVar149 = ZEXT3264(auVar74);
    auVar74 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar134 = ZEXT3264(auVar74);
    auVar141 = ZEXT3264(CONCAT428(0xfffffff8,
                                  CONCAT424(0xfffffff8,
                                            CONCAT420(0xfffffff8,
                                                      CONCAT416(0xfffffff8,
                                                                CONCAT412(0xfffffff8,
                                                                          CONCAT48(0xfffffff8,
                                                                                                                                                                      
                                                  0xfffffff8fffffff8)))))));
    local_2780 = context;
    local_2738 = uVar50;
    local_2740 = uVar59;
    local_2748 = uVar60;
    local_2750 = uVar61;
    local_2758 = uVar62;
    local_2760 = uVar57;
    local_27a0 = ray;
LAB_01c82bfb:
    if (local_27b0 != &local_23a0) {
      pfVar1 = (float *)(local_27b0 + -1);
      local_27b0 = local_27b0 + -2;
      if (*pfVar1 <= auVar111._0_4_) {
        uVar64 = *local_27b0;
LAB_01c82c23:
        uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
        auVar80._4_4_ = uVar2;
        auVar80._0_4_ = uVar2;
        auVar80._8_4_ = uVar2;
        auVar80._12_4_ = uVar2;
        auVar80._16_4_ = uVar2;
        auVar80._20_4_ = uVar2;
        auVar80._24_4_ = uVar2;
        auVar80._28_4_ = uVar2;
        while( true ) {
          if ((uVar64 & 8) != 0) break;
          pauVar48 = (undefined1 (*) [32])(uVar64 & 0xfffffffffffffff0);
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar48[8] + uVar50),auVar80,
                                    *(undefined1 (*) [32])(pauVar48[2] + uVar50));
          auVar74 = vsubps_avx(ZEXT1632(auVar68),auVar135._0_32_);
          auVar38._4_4_ = auVar128._4_4_ * auVar74._4_4_;
          auVar38._0_4_ = auVar128._0_4_ * auVar74._0_4_;
          auVar38._8_4_ = auVar128._8_4_ * auVar74._8_4_;
          auVar38._12_4_ = auVar128._12_4_ * auVar74._12_4_;
          auVar38._16_4_ = auVar128._16_4_ * auVar74._16_4_;
          auVar38._20_4_ = auVar128._20_4_ * auVar74._20_4_;
          auVar38._24_4_ = auVar128._24_4_ * auVar74._24_4_;
          auVar38._28_4_ = auVar74._28_4_;
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar48[8] + uVar59),auVar80,
                                    *(undefined1 (*) [32])(pauVar48[2] + uVar59));
          auVar74 = vsubps_avx(ZEXT1632(auVar68),auVar137._0_32_);
          auVar39._4_4_ = auVar143._4_4_ * auVar74._4_4_;
          auVar39._0_4_ = auVar143._0_4_ * auVar74._0_4_;
          auVar39._8_4_ = auVar143._8_4_ * auVar74._8_4_;
          auVar39._12_4_ = auVar143._12_4_ * auVar74._12_4_;
          auVar39._16_4_ = auVar143._16_4_ * auVar74._16_4_;
          auVar39._20_4_ = auVar143._20_4_ * auVar74._20_4_;
          auVar39._24_4_ = auVar143._24_4_ * auVar74._24_4_;
          auVar39._28_4_ = auVar74._28_4_;
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar48[8] + uVar60),auVar80,
                                    *(undefined1 (*) [32])(pauVar48[2] + uVar60));
          auVar74 = vsubps_avx(ZEXT1632(auVar68),auVar140._0_32_);
          auVar74 = vmulps_avx512vl(auVar144._0_32_,auVar74);
          auVar74 = vmaxps_avx(auVar39,auVar74);
          auVar75 = vmaxps_avx512vl(auVar148._0_32_,auVar38);
          auVar74 = vmaxps_avx(auVar75,auVar74);
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar48[8] + uVar61),auVar80,
                                    *(undefined1 (*) [32])(pauVar48[2] + uVar61));
          auVar75 = vsubps_avx(ZEXT1632(auVar68),auVar135._0_32_);
          auVar76 = vmulps_avx512vl(auVar145._0_32_,auVar75);
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar48[8] + uVar62),auVar80,
                                    *(undefined1 (*) [32])(pauVar48[2] + uVar62));
          auVar75 = vsubps_avx(ZEXT1632(auVar68),auVar137._0_32_);
          auVar77 = vmulps_avx512vl(auVar146._0_32_,auVar75);
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar48[8] + uVar57),auVar80,
                                    *(undefined1 (*) [32])(pauVar48[2] + uVar57));
          auVar75 = vsubps_avx(ZEXT1632(auVar68),auVar140._0_32_);
          auVar75 = vmulps_avx512vl(auVar147._0_32_,auVar75);
          auVar75 = vminps_avx(auVar77,auVar75);
          auVar76 = vminps_avx512vl(auVar149._0_32_,auVar76);
          auVar75 = vminps_avx(auVar76,auVar75);
          uVar66 = vcmpps_avx512vl(auVar74,auVar75,2);
          if (((uint)uVar64 & 7) == 6) {
            uVar64 = vcmpps_avx512vl(auVar80,pauVar48[0xe],0xd);
            uVar30 = vcmpps_avx512vl(auVar80,pauVar48[0xf],1);
            uVar66 = uVar66 & uVar64 & uVar30;
          }
          bVar45 = (byte)uVar66;
          if (bVar45 == 0) {
            auVar68 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar111 = ZEXT1664(auVar68);
            goto LAB_01c82bfb;
          }
          auVar75 = *pauVar48;
          auVar76 = pauVar48[1];
          auVar77 = vpternlogd_avx512vl(auVar134._0_32_,auVar74,auVar141._0_32_,0xf8);
          auVar78 = vpcompressd_avx512vl(auVar77);
          auVar79._0_4_ =
               (uint)(bVar45 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar77._0_4_;
          bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar79._4_4_ = (uint)bVar65 * auVar78._4_4_ | (uint)!bVar65 * auVar77._4_4_;
          bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar79._8_4_ = (uint)bVar65 * auVar78._8_4_ | (uint)!bVar65 * auVar77._8_4_;
          bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar79._12_4_ = (uint)bVar65 * auVar78._12_4_ | (uint)!bVar65 * auVar77._12_4_;
          bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar79._16_4_ = (uint)bVar65 * auVar78._16_4_ | (uint)!bVar65 * auVar77._16_4_;
          bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar79._20_4_ = (uint)bVar65 * auVar78._20_4_ | (uint)!bVar65 * auVar77._20_4_;
          bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar79._24_4_ = (uint)bVar65 * auVar78._24_4_ | (uint)!bVar65 * auVar77._24_4_;
          bVar65 = SUB81(uVar66 >> 7,0);
          auVar79._28_4_ = (uint)bVar65 * auVar78._28_4_ | (uint)!bVar65 * auVar77._28_4_;
          auVar77 = vpermt2q_avx512vl(auVar75,auVar79,auVar76);
          uVar64 = auVar77._0_8_;
          bVar45 = bVar45 - 1 & bVar45;
          if (bVar45 != 0) goto LAB_01c82d7d;
        }
        local_2770 = (ulong)((uint)uVar64 & 0xf) - 8;
        uVar64 = uVar64 & 0xfffffffffffffff0;
        local_23e0 = auVar149._0_32_;
        local_2730 = uVar64;
        for (local_2768 = 0; local_2768 != local_2770; local_2768 = local_2768 + 1) {
          lVar49 = local_2768 * 0xe0;
          local_2728 = uVar64 + lVar49;
          fVar117 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(uVar64 + 0xd0 + lVar49))
                    * *(float *)(uVar64 + 0xd4 + lVar49);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = *(ulong *)(uVar64 + 0x40 + lVar49);
          auVar115._8_8_ = 0;
          auVar115._0_8_ = *(ulong *)(uVar64 + 0x48 + lVar49);
          uVar126 = vpcmpub_avx512vl(auVar112,auVar115,2);
          auVar74 = vpmovzxbd_avx2(auVar112);
          uVar2 = *(undefined4 *)(uVar64 + 0x7c + lVar49);
          auVar83._4_4_ = uVar2;
          auVar83._0_4_ = uVar2;
          auVar83._8_4_ = uVar2;
          auVar83._12_4_ = uVar2;
          auVar83._16_4_ = uVar2;
          auVar83._20_4_ = uVar2;
          auVar83._24_4_ = uVar2;
          auVar83._28_4_ = uVar2;
          auVar74 = vcvtdq2ps_avx(auVar74);
          uVar2 = *(undefined4 *)(uVar64 + 0x70 + lVar49);
          auVar81._4_4_ = uVar2;
          auVar81._0_4_ = uVar2;
          auVar81._8_4_ = uVar2;
          auVar81._12_4_ = uVar2;
          auVar81._16_4_ = uVar2;
          auVar81._20_4_ = uVar2;
          auVar81._24_4_ = uVar2;
          auVar81._28_4_ = uVar2;
          auVar68 = vfmadd213ps_fma(auVar74,auVar83,auVar81);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(uVar64 + 0x88 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar73);
          auVar74 = vcvtdq2ps_avx(auVar74);
          uVar2 = *(undefined4 *)(uVar64 + 0xc4 + lVar49);
          auVar86._4_4_ = uVar2;
          auVar86._0_4_ = uVar2;
          auVar86._8_4_ = uVar2;
          auVar86._12_4_ = uVar2;
          auVar86._16_4_ = uVar2;
          auVar86._20_4_ = uVar2;
          auVar86._24_4_ = uVar2;
          auVar86._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(uVar64 + 0xb8 + lVar49);
          auVar87._4_4_ = uVar2;
          auVar87._0_4_ = uVar2;
          auVar87._8_4_ = uVar2;
          auVar87._12_4_ = uVar2;
          auVar87._16_4_ = uVar2;
          auVar87._20_4_ = uVar2;
          auVar87._24_4_ = uVar2;
          auVar87._28_4_ = uVar2;
          auVar73 = vfmadd213ps_fma(auVar74,auVar86,auVar87);
          auVar78._4_4_ = fVar117;
          auVar78._0_4_ = fVar117;
          auVar78._8_4_ = fVar117;
          auVar78._12_4_ = fVar117;
          auVar78._16_4_ = fVar117;
          auVar78._20_4_ = fVar117;
          auVar78._24_4_ = fVar117;
          auVar78._28_4_ = fVar117;
          auVar74 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar68));
          auVar68 = vfmadd213ps_fma(auVar74,auVar78,ZEXT1632(auVar68));
          auVar74 = vpmovzxbd_avx2(auVar115);
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar73 = vfmadd213ps_fma(auVar74,auVar83,auVar81);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(uVar64 + 0x90 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar5);
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar69 = vfmadd213ps_fma(auVar74,auVar86,auVar87);
          auVar74 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar73));
          auVar73 = vfmadd213ps_fma(auVar74,auVar78,ZEXT1632(auVar73));
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(uVar64 + 0x50 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar6);
          uVar2 = *(undefined4 *)(uVar64 + 0x80 + lVar49);
          auVar82._4_4_ = uVar2;
          auVar82._0_4_ = uVar2;
          auVar82._8_4_ = uVar2;
          auVar82._12_4_ = uVar2;
          auVar82._16_4_ = uVar2;
          auVar82._20_4_ = uVar2;
          auVar82._24_4_ = uVar2;
          auVar82._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(uVar64 + 0x74 + lVar49);
          auVar84._4_4_ = uVar2;
          auVar84._0_4_ = uVar2;
          auVar84._8_4_ = uVar2;
          auVar84._12_4_ = uVar2;
          auVar84._16_4_ = uVar2;
          auVar84._20_4_ = uVar2;
          auVar84._24_4_ = uVar2;
          auVar84._28_4_ = uVar2;
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar69 = vfmadd213ps_fma(auVar74,auVar82,auVar84);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(uVar64 + 0x98 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar7);
          uVar2 = *(undefined4 *)(uVar64 + 200 + lVar49);
          auVar88._4_4_ = uVar2;
          auVar88._0_4_ = uVar2;
          auVar88._8_4_ = uVar2;
          auVar88._12_4_ = uVar2;
          auVar88._16_4_ = uVar2;
          auVar88._20_4_ = uVar2;
          auVar88._24_4_ = uVar2;
          auVar88._28_4_ = uVar2;
          auVar74 = vcvtdq2ps_avx(auVar74);
          uVar2 = *(undefined4 *)(uVar64 + 0xbc + lVar49);
          auVar90._4_4_ = uVar2;
          auVar90._0_4_ = uVar2;
          auVar90._8_4_ = uVar2;
          auVar90._12_4_ = uVar2;
          auVar90._16_4_ = uVar2;
          auVar90._20_4_ = uVar2;
          auVar90._24_4_ = uVar2;
          auVar90._28_4_ = uVar2;
          auVar29 = vfmadd213ps_fma(auVar74,auVar88,auVar90);
          auVar74 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar74,auVar78,ZEXT1632(auVar69));
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(uVar64 + 0x58 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar8);
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar29 = vfmadd213ps_fma(auVar74,auVar82,auVar84);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(uVar64 + 0xa0 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar9);
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar72 = vfmadd213ps_fma(auVar74,auVar88,auVar90);
          auVar74 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar29));
          auVar29 = vfmadd213ps_fma(auVar74,auVar78,ZEXT1632(auVar29));
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(uVar64 + 0x60 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar10);
          auVar74 = vcvtdq2ps_avx(auVar74);
          uVar2 = *(undefined4 *)(uVar64 + 0x84 + lVar49);
          auVar85._4_4_ = uVar2;
          auVar85._0_4_ = uVar2;
          auVar85._8_4_ = uVar2;
          auVar85._12_4_ = uVar2;
          auVar85._16_4_ = uVar2;
          auVar85._20_4_ = uVar2;
          auVar85._24_4_ = uVar2;
          auVar85._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(uVar64 + 0x78 + lVar49);
          auVar89._4_4_ = uVar2;
          auVar89._0_4_ = uVar2;
          auVar89._8_4_ = uVar2;
          auVar89._12_4_ = uVar2;
          auVar89._16_4_ = uVar2;
          auVar89._20_4_ = uVar2;
          auVar89._24_4_ = uVar2;
          auVar89._28_4_ = uVar2;
          auVar72 = vfmadd213ps_fma(auVar74,auVar85,auVar89);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(uVar64 + 0xa8 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar11);
          uVar2 = *(undefined4 *)(uVar64 + 0xcc + lVar49);
          auVar91._4_4_ = uVar2;
          auVar91._0_4_ = uVar2;
          auVar91._8_4_ = uVar2;
          auVar91._12_4_ = uVar2;
          auVar91._16_4_ = uVar2;
          auVar91._20_4_ = uVar2;
          auVar91._24_4_ = uVar2;
          auVar91._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(uVar64 + 0xc0 + lVar49);
          auVar92._4_4_ = uVar2;
          auVar92._0_4_ = uVar2;
          auVar92._8_4_ = uVar2;
          auVar92._12_4_ = uVar2;
          auVar92._16_4_ = uVar2;
          auVar92._20_4_ = uVar2;
          auVar92._24_4_ = uVar2;
          auVar92._28_4_ = uVar2;
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar70 = vfmadd213ps_fma(auVar74,auVar91,auVar92);
          auVar74 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar72));
          auVar72 = vfmadd213ps_fma(auVar74,auVar78,ZEXT1632(auVar72));
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(uVar64 + 0x68 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar12);
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar70 = vfmadd213ps_fma(auVar74,auVar85,auVar89);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(uVar64 + 0xb0 + lVar49);
          auVar74 = vpmovzxbd_avx2(auVar13);
          auVar74 = vcvtdq2ps_avx(auVar74);
          auVar71 = vfmadd213ps_fma(auVar74,auVar91,auVar92);
          auVar74 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar70));
          auVar70 = vfmadd213ps_fma(auVar74,auVar78,ZEXT1632(auVar70));
          auVar74 = vsubps_avx(ZEXT1632(auVar68),auVar135._0_32_);
          auVar76._4_4_ = auVar128._4_4_ * auVar74._4_4_;
          auVar76._0_4_ = auVar128._0_4_ * auVar74._0_4_;
          auVar76._8_4_ = auVar128._8_4_ * auVar74._8_4_;
          auVar76._12_4_ = auVar128._12_4_ * auVar74._12_4_;
          auVar76._16_4_ = auVar128._16_4_ * auVar74._16_4_;
          auVar76._20_4_ = auVar128._20_4_ * auVar74._20_4_;
          auVar76._24_4_ = auVar128._24_4_ * auVar74._24_4_;
          auVar76._28_4_ = auVar74._28_4_;
          auVar74 = vsubps_avx(ZEXT1632(auVar69),auVar137._0_32_);
          auVar77._4_4_ = auVar143._4_4_ * auVar74._4_4_;
          auVar77._0_4_ = auVar143._0_4_ * auVar74._0_4_;
          auVar77._8_4_ = auVar143._8_4_ * auVar74._8_4_;
          auVar77._12_4_ = auVar143._12_4_ * auVar74._12_4_;
          auVar77._16_4_ = auVar143._16_4_ * auVar74._16_4_;
          auVar77._20_4_ = auVar143._20_4_ * auVar74._20_4_;
          auVar77._24_4_ = auVar143._24_4_ * auVar74._24_4_;
          auVar77._28_4_ = auVar74._28_4_;
          auVar74 = vsubps_avx(ZEXT1632(auVar72),auVar140._0_32_);
          auVar78 = vmulps_avx512vl(auVar144._0_32_,auVar74);
          auVar74 = vsubps_avx(ZEXT1632(auVar73),auVar135._0_32_);
          auVar80 = vmulps_avx512vl(auVar145._0_32_,auVar74);
          auVar74 = vsubps_avx(ZEXT1632(auVar29),auVar137._0_32_);
          auVar83 = vmulps_avx512vl(auVar146._0_32_,auVar74);
          auVar74 = vsubps_avx(ZEXT1632(auVar70),auVar140._0_32_);
          auVar82 = vmulps_avx512vl(auVar147._0_32_,auVar74);
          auVar75 = vpminsd_avx2(auVar76,auVar80);
          auVar74 = vpmaxsd_avx2(auVar76,auVar80);
          auVar80 = vpminsd_avx2(auVar77,auVar83);
          auVar75 = vpmaxsd_avx2(auVar75,auVar80);
          auVar80 = vpmaxsd_avx2(auVar77,auVar83);
          auVar80 = vpminsd_avx2(auVar74,auVar80);
          auVar76 = vpminsd_avx2(auVar78,auVar82);
          auVar74 = vpmaxsd_avx2(auVar78,auVar82);
          auVar76 = vpmaxsd_avx512vl(auVar76,auVar148._0_32_);
          local_23c0 = vpmaxsd_avx2(auVar75,auVar76);
          auVar74 = vpminsd_avx512vl(auVar74,auVar149._0_32_);
          auVar74 = vpminsd_avx2(auVar80,auVar74);
          uVar32 = vpcmpd_avx512vl(local_23c0,auVar74,2);
          local_2708 = CONCAT44((int)(uVar64 + lVar49 >> 0x20),
                                (uint)(byte)((byte)uVar126 & (byte)uVar32));
          while (local_2708 != 0) {
            lVar49 = 0;
            for (uVar66 = local_2708; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000)
            {
              lVar49 = lVar49 + 1;
            }
            local_2708 = local_2708 - 1 & local_2708;
            fVar117 = (ray->super_RayK<1>).tfar;
            if (*(float *)(local_23c0 + lVar49 * 4) <= fVar117) {
              uVar14 = *(ushort *)(local_2728 + lVar49 * 8);
              uVar15 = *(ushort *)(local_2728 + 2 + lVar49 * 8);
              local_2788 = (uint)uVar15;
              uVar16 = *(uint *)(local_2728 + 0xd8);
              local_2798 = (ulong)uVar16;
              uVar54 = *(uint *)(local_2728 + 4 + lVar49 * 8);
              local_2710 = context->scene;
              pGVar17 = (local_2710->geometries).items[local_2798].ptr;
              local_2718 = *(long *)&pGVar17->field_0x58;
              local_2778 = (ulong)uVar54;
              local_2720 = pGVar17[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar54;
              fVar3 = (pGVar17->time_range).lower;
              fVar3 = pGVar17->fnumTimeSegments *
                      (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar3) /
                      ((pGVar17->time_range).upper - fVar3));
              auVar68 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
              auVar68 = vminss_avx(auVar68,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
              auVar71 = vmaxss_avx(ZEXT816(0) << 0x20,auVar68);
              local_278c = uVar14 & 0x7fff;
              local_2790 = local_2788 & 0x7fff;
              uVar47 = *(uint *)(local_2718 + 4 + local_2720);
              uVar59 = (ulong)uVar47;
              uVar50 = (ulong)(uVar47 * local_2790 + *(int *)(local_2718 + local_2720) + local_278c)
              ;
              lVar18 = *(long *)&pGVar17[2].numPrimitives;
              local_2680._0_8_ = lVar18;
              lVar63 = (long)(int)auVar71._0_4_ * 0x38;
              lVar19 = *(long *)(lVar18 + 0x10 + lVar63);
              lVar20 = *(long *)(lVar18 + lVar63);
              auVar68 = *(undefined1 (*) [16])(lVar20 + lVar19 * uVar50);
              lVar21 = *(long *)(lVar18 + 0x48 + lVar63);
              lVar58 = lVar21 * (uVar50 + 1);
              local_26a0._0_8_ = lVar58;
              auVar73 = *(undefined1 (*) [16])(lVar20 + (uVar50 + 1) * lVar19);
              lVar49 = uVar50 + uVar59;
              auVar69 = *(undefined1 (*) [16])(lVar20 + lVar49 * lVar19);
              lVar56 = uVar50 + uVar59 + 1;
              auVar29 = *(undefined1 (*) [16])(lVar20 + lVar56 * lVar19);
              uVar57 = (ulong)(-1 < (short)uVar14);
              lVar51 = uVar50 + uVar57 + 1;
              auVar72 = *(undefined1 (*) [16])(lVar20 + lVar51 * lVar19);
              lVar55 = uVar57 + lVar56;
              auVar70 = *(undefined1 (*) [16])(lVar20 + lVar55 * lVar19);
              uVar57 = 0;
              if (-1 < (short)uVar15) {
                uVar57 = uVar59;
              }
              auVar5 = *(undefined1 (*) [16])(lVar20 + (lVar49 + uVar57) * lVar19);
              auVar6 = *(undefined1 (*) [16])(lVar20 + (lVar56 + uVar57) * lVar19);
              auVar7 = *(undefined1 (*) [16])(lVar20 + lVar19 * (uVar57 + lVar55));
              lVar18 = *(long *)(lVar18 + 0x38 + lVar63);
              fVar3 = fVar3 - auVar71._0_4_;
              auVar113._4_4_ = fVar3;
              auVar113._0_4_ = fVar3;
              auVar113._8_4_ = fVar3;
              auVar113._12_4_ = fVar3;
              auVar71 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + lVar21 * uVar50),auVar68);
              auVar8 = vfmadd213ps_fma(auVar71,auVar113,auVar68);
              auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + lVar58),auVar73);
              auVar9 = vfmadd213ps_fma(auVar68,auVar113,auVar73);
              auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + lVar21 * lVar49),auVar69);
              auVar10 = vfmadd213ps_fma(auVar68,auVar113,auVar69);
              auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + lVar21 * lVar56),auVar29);
              auVar11 = vfmadd213ps_fma(auVar68,auVar113,auVar29);
              auVar68 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar18 + lVar21 * lVar51),auVar72);
              auVar73 = vfmadd213ps_fma(auVar68,auVar113,auVar72);
              auVar68 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar18 + lVar21 * lVar55),auVar70);
              auVar12 = vfmadd213ps_fma(auVar68,auVar113,auVar70);
              auVar68 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar18 + lVar21 * (lVar49 + uVar57)),
                                        auVar5);
              auVar5 = vfmadd213ps_fma(auVar68,auVar113,auVar5);
              auVar68 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar18 + lVar21 * (lVar56 + uVar57)),
                                        auVar6);
              auVar6 = vfmadd213ps_fma(auVar68,auVar113,auVar6);
              auVar68 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar18 + (uVar57 + lVar55) * lVar21),
                                        auVar7);
              auVar7 = vfmadd213ps_fma(auVar68,auVar113,auVar7);
              auVar69 = vunpcklps_avx(auVar9,auVar12);
              auVar68 = vunpckhps_avx(auVar9,auVar12);
              auVar29 = vunpcklps_avx(auVar73,auVar11);
              auVar73 = vunpckhps_avx(auVar73,auVar11);
              auVar72 = vunpcklps_avx(auVar68,auVar73);
              auVar70 = vunpcklps_avx(auVar69,auVar29);
              auVar68 = vunpckhps_avx(auVar69,auVar29);
              auVar29 = vunpcklps_avx(auVar10,auVar6);
              auVar73 = vunpckhps_avx(auVar10,auVar6);
              auVar71 = vunpcklps_avx(auVar11,auVar5);
              auVar69 = vunpckhps_avx(auVar11,auVar5);
              auVar69 = vunpcklps_avx(auVar73,auVar69);
              auVar5 = vunpcklps_avx(auVar29,auVar71);
              auVar73 = vunpckhps_avx(auVar29,auVar71);
              auVar123._16_16_ = auVar6;
              auVar123._0_16_ = auVar10;
              auVar119._16_16_ = auVar12;
              auVar119._0_16_ = auVar9;
              auVar74 = vunpcklps_avx(auVar119,auVar123);
              auVar129._16_16_ = auVar7;
              auVar129._0_16_ = auVar11;
              auVar116._16_16_ = auVar11;
              auVar116._0_16_ = auVar8;
              auVar75 = vunpcklps_avx(auVar116,auVar129);
              auVar76 = vunpcklps_avx(auVar75,auVar74);
              auVar75 = vunpckhps_avx(auVar75,auVar74);
              auVar74 = vunpckhps_avx(auVar119,auVar123);
              auVar80 = vunpckhps_avx(auVar116,auVar129);
              auVar80 = vunpcklps_avx(auVar80,auVar74);
              auVar120._16_16_ = auVar70;
              auVar120._0_16_ = auVar70;
              auVar97._16_16_ = auVar68;
              auVar97._0_16_ = auVar68;
              auVar124._16_16_ = auVar72;
              auVar124._0_16_ = auVar72;
              auVar130._16_16_ = auVar5;
              auVar130._0_16_ = auVar5;
              auVar138._16_16_ = auVar73;
              auVar138._0_16_ = auVar73;
              uVar2 = *(undefined4 *)&(local_27a0->super_RayK<1>).org.field_0;
              auVar142._4_4_ = uVar2;
              auVar142._0_4_ = uVar2;
              auVar142._8_4_ = uVar2;
              auVar142._12_4_ = uVar2;
              auVar142._16_4_ = uVar2;
              auVar142._20_4_ = uVar2;
              auVar142._24_4_ = uVar2;
              auVar142._28_4_ = uVar2;
              auVar77 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(local_27a0->super_RayK<1>).org.field_0.m128[1]));
              auVar78 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(local_27a0->super_RayK<1>).org.field_0.m128[2]));
              uVar2 = *(undefined4 *)&(local_27a0->super_RayK<1>).dir.field_0;
              auVar127._4_4_ = uVar2;
              auVar127._0_4_ = uVar2;
              auVar127._8_4_ = uVar2;
              auVar127._12_4_ = uVar2;
              auVar127._16_4_ = uVar2;
              auVar127._20_4_ = uVar2;
              auVar127._24_4_ = uVar2;
              auVar127._28_4_ = uVar2;
              auVar83 = vinsertf32x4_avx512vl(ZEXT1632(auVar69),auVar69,1);
              uVar2 = *(undefined4 *)((long)&(local_27a0->super_RayK<1>).dir.field_0 + 4);
              auVar132._4_4_ = uVar2;
              auVar132._0_4_ = uVar2;
              auVar132._8_4_ = uVar2;
              auVar132._12_4_ = uVar2;
              auVar132._16_4_ = uVar2;
              auVar132._20_4_ = uVar2;
              auVar132._24_4_ = uVar2;
              auVar132._28_4_ = uVar2;
              fVar3 = (local_27a0->super_RayK<1>).dir.field_0.m128[2];
              auVar136._4_4_ = fVar3;
              auVar136._0_4_ = fVar3;
              auVar136._8_4_ = fVar3;
              auVar136._12_4_ = fVar3;
              auVar136._16_4_ = fVar3;
              auVar136._20_4_ = fVar3;
              auVar136._24_4_ = fVar3;
              auVar136._28_4_ = fVar3;
              auVar74 = vsubps_avx(auVar76,auVar142);
              auVar76 = vsubps_avx512vl(auVar75,auVar77);
              auVar80 = vsubps_avx512vl(auVar80,auVar78);
              auVar75 = vsubps_avx(auVar120,auVar142);
              auVar82 = vsubps_avx512vl(auVar97,auVar77);
              auVar81 = vsubps_avx512vl(auVar124,auVar78);
              auVar84 = vsubps_avx512vl(auVar130,auVar142);
              auVar77 = vsubps_avx512vl(auVar138,auVar77);
              auVar78 = vsubps_avx512vl(auVar83,auVar78);
              auVar83 = vsubps_avx512vl(auVar84,auVar74);
              auVar85 = vsubps_avx512vl(auVar77,auVar76);
              auVar86 = vsubps_avx512vl(auVar78,auVar80);
              auVar87 = vsubps_avx512vl(auVar74,auVar75);
              auVar88 = vsubps_avx512vl(auVar76,auVar82);
              auVar89 = vsubps_avx512vl(auVar80,auVar81);
              auVar90 = vsubps_avx512vl(auVar75,auVar84);
              auVar91 = vsubps_avx512vl(auVar82,auVar77);
              auVar92 = vsubps_avx512vl(auVar81,auVar78);
              auVar93 = vaddps_avx512vl(auVar84,auVar74);
              auVar94 = vaddps_avx512vl(auVar77,auVar76);
              auVar95 = vaddps_avx512vl(auVar78,auVar80);
              auVar96 = vmulps_avx512vl(auVar94,auVar86);
              auVar96 = vfmsub231ps_avx512vl(auVar96,auVar85,auVar95);
              auVar95 = vmulps_avx512vl(auVar95,auVar83);
              auVar95 = vfmsub231ps_avx512vl(auVar95,auVar86,auVar93);
              auVar93 = vmulps_avx512vl(auVar93,auVar85);
              auVar68 = vfmsub231ps_fma(auVar93,auVar83,auVar94);
              auVar131._0_4_ = fVar3 * auVar68._0_4_;
              auVar131._4_4_ = fVar3 * auVar68._4_4_;
              auVar131._8_4_ = fVar3 * auVar68._8_4_;
              auVar131._12_4_ = fVar3 * auVar68._12_4_;
              auVar131._16_4_ = fVar3 * 0.0;
              auVar131._20_4_ = fVar3 * 0.0;
              auVar131._24_4_ = fVar3 * 0.0;
              auVar131._28_4_ = 0;
              auVar93 = vfmadd231ps_avx512vl(auVar131,auVar132,auVar95);
              auVar97 = vfmadd231ps_avx512vl(auVar93,auVar127,auVar96);
              auVar139._0_4_ = auVar74._0_4_ + auVar75._0_4_;
              auVar139._4_4_ = auVar74._4_4_ + auVar75._4_4_;
              auVar139._8_4_ = auVar74._8_4_ + auVar75._8_4_;
              auVar139._12_4_ = auVar74._12_4_ + auVar75._12_4_;
              auVar139._16_4_ = auVar74._16_4_ + auVar75._16_4_;
              auVar139._20_4_ = auVar74._20_4_ + auVar75._20_4_;
              auVar139._24_4_ = auVar74._24_4_ + auVar75._24_4_;
              auVar139._28_4_ = auVar74._28_4_ + auVar75._28_4_;
              auVar93 = vaddps_avx512vl(auVar76,auVar82);
              auVar94 = vaddps_avx512vl(auVar80,auVar81);
              auVar95 = vmulps_avx512vl(auVar93,auVar89);
              auVar95 = vfmsub231ps_avx512vl(auVar95,auVar88,auVar94);
              auVar94 = vmulps_avx512vl(auVar94,auVar87);
              auVar94 = vfmsub231ps_avx512vl(auVar94,auVar89,auVar139);
              auVar96 = vmulps_avx512vl(auVar139,auVar88);
              auVar93 = vfmsub231ps_avx512vl(auVar96,auVar87,auVar93);
              auVar96._4_4_ = fVar3 * auVar93._4_4_;
              auVar96._0_4_ = fVar3 * auVar93._0_4_;
              auVar96._8_4_ = fVar3 * auVar93._8_4_;
              auVar96._12_4_ = fVar3 * auVar93._12_4_;
              auVar96._16_4_ = fVar3 * auVar93._16_4_;
              auVar96._20_4_ = fVar3 * auVar93._20_4_;
              auVar96._24_4_ = fVar3 * auVar93._24_4_;
              auVar96._28_4_ = auVar93._28_4_;
              auVar93 = vfmadd231ps_avx512vl(auVar96,auVar132,auVar94);
              auVar96 = vfmadd231ps_avx512vl(auVar93,auVar127,auVar95);
              auVar75 = vaddps_avx512vl(auVar75,auVar84);
              auVar77 = vaddps_avx512vl(auVar82,auVar77);
              auVar78 = vaddps_avx512vl(auVar81,auVar78);
              auVar82 = vmulps_avx512vl(auVar77,auVar92);
              auVar82 = vfmsub231ps_avx512vl(auVar82,auVar91,auVar78);
              auVar78 = vmulps_avx512vl(auVar78,auVar90);
              auVar78 = vfmsub231ps_avx512vl(auVar78,auVar92,auVar75);
              auVar40._4_4_ = auVar75._4_4_ * auVar91._4_4_;
              auVar40._0_4_ = auVar75._0_4_ * auVar91._0_4_;
              auVar40._8_4_ = auVar75._8_4_ * auVar91._8_4_;
              auVar40._12_4_ = auVar75._12_4_ * auVar91._12_4_;
              auVar40._16_4_ = auVar75._16_4_ * auVar91._16_4_;
              auVar40._20_4_ = auVar75._20_4_ * auVar91._20_4_;
              auVar40._24_4_ = auVar75._24_4_ * auVar91._24_4_;
              auVar40._28_4_ = auVar75._28_4_;
              auVar68 = vfmsub231ps_fma(auVar40,auVar90,auVar77);
              auVar75 = vmulps_avx512vl(auVar136,ZEXT1632(auVar68));
              auVar75 = vfmadd231ps_avx512vl(auVar75,auVar132,auVar78);
              auVar75 = vfmadd231ps_avx512vl(auVar75,auVar127,auVar82);
              auVar114._0_4_ = auVar97._0_4_ + auVar96._0_4_;
              auVar114._4_4_ = auVar97._4_4_ + auVar96._4_4_;
              auVar114._8_4_ = auVar97._8_4_ + auVar96._8_4_;
              auVar114._12_4_ = auVar97._12_4_ + auVar96._12_4_;
              auVar114._16_4_ = auVar97._16_4_ + auVar96._16_4_;
              auVar114._20_4_ = auVar97._20_4_ + auVar96._20_4_;
              auVar114._24_4_ = auVar97._24_4_ + auVar96._24_4_;
              auVar114._28_4_ = auVar97._28_4_ + auVar96._28_4_;
              local_2620 = vaddps_avx512vl(auVar75,auVar114);
              auVar93._8_4_ = 0x7fffffff;
              auVar93._0_8_ = 0x7fffffff7fffffff;
              auVar93._12_4_ = 0x7fffffff;
              auVar93._16_4_ = 0x7fffffff;
              auVar93._20_4_ = 0x7fffffff;
              auVar93._24_4_ = 0x7fffffff;
              auVar93._28_4_ = 0x7fffffff;
              vandps_avx512vl(local_2620,auVar93);
              auVar94._8_4_ = 0x34000000;
              auVar94._0_8_ = 0x3400000034000000;
              auVar94._12_4_ = 0x34000000;
              auVar94._16_4_ = 0x34000000;
              auVar94._20_4_ = 0x34000000;
              auVar94._24_4_ = 0x34000000;
              auVar94._28_4_ = 0x34000000;
              auVar77 = vmulps_avx512vl(local_2620,auVar94);
              auVar78 = vminps_avx512vl(auVar97,auVar96);
              auVar78 = vminps_avx512vl(auVar78,auVar75);
              auVar95._8_4_ = 0x80000000;
              auVar95._0_8_ = 0x8000000080000000;
              auVar95._12_4_ = 0x80000000;
              auVar95._16_4_ = 0x80000000;
              auVar95._20_4_ = 0x80000000;
              auVar95._24_4_ = 0x80000000;
              auVar95._28_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar77,auVar95);
              uVar126 = vcmpps_avx512vl(auVar78,auVar82,5);
              auVar78 = vmaxps_avx512vl(auVar97,auVar96);
              auVar75 = vmaxps_avx512vl(auVar78,auVar75);
              uVar32 = vcmpps_avx512vl(auVar75,auVar77,2);
              bVar45 = (byte)uVar126 | (byte)uVar32;
              ray = local_27a0;
              if (bVar45 != 0) {
                auVar75 = vmulps_avx512vl(auVar86,auVar88);
                auVar77 = vmulps_avx512vl(auVar83,auVar89);
                auVar78 = vmulps_avx512vl(auVar85,auVar87);
                auVar82 = vmulps_avx512vl(auVar89,auVar91);
                auVar81 = vmulps_avx512vl(auVar87,auVar92);
                auVar84 = vmulps_avx512vl(auVar88,auVar90);
                auVar85 = vfmsub213ps_avx512vl(auVar85,auVar89,auVar75);
                auVar86 = vfmsub213ps_avx512vl(auVar86,auVar87,auVar77);
                auVar83 = vfmsub213ps_avx512vl(auVar83,auVar88,auVar78);
                auVar88 = vfmsub213ps_avx512vl(auVar92,auVar88,auVar82);
                auVar89 = vfmsub213ps_avx512vl(auVar90,auVar89,auVar81);
                auVar87 = vfmsub213ps_avx512vl(auVar91,auVar87,auVar84);
                auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                vandps_avx512vl(auVar75,auVar90);
                vandps_avx512vl(auVar82,auVar90);
                uVar57 = vcmpps_avx512vl(auVar90,auVar90,1);
                vandps_avx512vl(auVar77,auVar90);
                vandps_avx512vl(auVar81,auVar90);
                uVar50 = vcmpps_avx512vl(auVar90,auVar90,1);
                vandps_avx512vl(auVar78,auVar90);
                vandps_avx512vl(auVar84,auVar90);
                uVar59 = vcmpps_avx512vl(auVar90,auVar90,1);
                bVar65 = (bool)((byte)uVar57 & 1);
                auVar98._0_4_ =
                     (float)((uint)bVar65 * auVar85._0_4_ | (uint)!bVar65 * auVar88._0_4_);
                bVar65 = (bool)((byte)(uVar57 >> 1) & 1);
                auVar98._4_4_ =
                     (float)((uint)bVar65 * auVar85._4_4_ | (uint)!bVar65 * auVar88._4_4_);
                bVar65 = (bool)((byte)(uVar57 >> 2) & 1);
                auVar98._8_4_ =
                     (float)((uint)bVar65 * auVar85._8_4_ | (uint)!bVar65 * auVar88._8_4_);
                bVar65 = (bool)((byte)(uVar57 >> 3) & 1);
                auVar98._12_4_ =
                     (float)((uint)bVar65 * auVar85._12_4_ | (uint)!bVar65 * auVar88._12_4_);
                bVar65 = (bool)((byte)(uVar57 >> 4) & 1);
                auVar98._16_4_ =
                     (float)((uint)bVar65 * auVar85._16_4_ | (uint)!bVar65 * auVar88._16_4_);
                bVar65 = (bool)((byte)(uVar57 >> 5) & 1);
                auVar98._20_4_ =
                     (float)((uint)bVar65 * auVar85._20_4_ | (uint)!bVar65 * auVar88._20_4_);
                bVar65 = (bool)((byte)(uVar57 >> 6) & 1);
                auVar98._24_4_ =
                     (float)((uint)bVar65 * auVar85._24_4_ | (uint)!bVar65 * auVar88._24_4_);
                bVar65 = SUB81(uVar57 >> 7,0);
                auVar98._28_4_ = (uint)bVar65 * auVar85._28_4_ | (uint)!bVar65 * auVar88._28_4_;
                bVar65 = (bool)((byte)uVar50 & 1);
                auVar99._0_4_ =
                     (float)((uint)bVar65 * auVar86._0_4_ | (uint)!bVar65 * auVar89._0_4_);
                bVar65 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar99._4_4_ =
                     (float)((uint)bVar65 * auVar86._4_4_ | (uint)!bVar65 * auVar89._4_4_);
                bVar65 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar99._8_4_ =
                     (float)((uint)bVar65 * auVar86._8_4_ | (uint)!bVar65 * auVar89._8_4_);
                bVar65 = (bool)((byte)(uVar50 >> 3) & 1);
                auVar99._12_4_ =
                     (float)((uint)bVar65 * auVar86._12_4_ | (uint)!bVar65 * auVar89._12_4_);
                bVar65 = (bool)((byte)(uVar50 >> 4) & 1);
                auVar99._16_4_ =
                     (float)((uint)bVar65 * auVar86._16_4_ | (uint)!bVar65 * auVar89._16_4_);
                bVar65 = (bool)((byte)(uVar50 >> 5) & 1);
                auVar99._20_4_ =
                     (float)((uint)bVar65 * auVar86._20_4_ | (uint)!bVar65 * auVar89._20_4_);
                bVar65 = (bool)((byte)(uVar50 >> 6) & 1);
                auVar99._24_4_ =
                     (float)((uint)bVar65 * auVar86._24_4_ | (uint)!bVar65 * auVar89._24_4_);
                bVar65 = SUB81(uVar50 >> 7,0);
                auVar99._28_4_ = (uint)bVar65 * auVar86._28_4_ | (uint)!bVar65 * auVar89._28_4_;
                bVar65 = (bool)((byte)uVar59 & 1);
                fVar67 = (float)((uint)bVar65 * auVar83._0_4_ | (uint)!bVar65 * auVar87._0_4_);
                bVar65 = (bool)((byte)(uVar59 >> 1) & 1);
                fVar102 = (float)((uint)bVar65 * auVar83._4_4_ | (uint)!bVar65 * auVar87._4_4_);
                bVar65 = (bool)((byte)(uVar59 >> 2) & 1);
                fVar103 = (float)((uint)bVar65 * auVar83._8_4_ | (uint)!bVar65 * auVar87._8_4_);
                bVar65 = (bool)((byte)(uVar59 >> 3) & 1);
                fVar104 = (float)((uint)bVar65 * auVar83._12_4_ | (uint)!bVar65 * auVar87._12_4_);
                bVar65 = (bool)((byte)(uVar59 >> 4) & 1);
                fVar105 = (float)((uint)bVar65 * auVar83._16_4_ | (uint)!bVar65 * auVar87._16_4_);
                bVar65 = (bool)((byte)(uVar59 >> 5) & 1);
                fVar106 = (float)((uint)bVar65 * auVar83._20_4_ | (uint)!bVar65 * auVar87._20_4_);
                bVar65 = (bool)((byte)(uVar59 >> 6) & 1);
                fVar107 = (float)((uint)bVar65 * auVar83._24_4_ | (uint)!bVar65 * auVar87._24_4_);
                bVar65 = SUB81(uVar59 >> 7,0);
                auVar41._4_4_ = fVar3 * fVar102;
                auVar41._0_4_ = fVar3 * fVar67;
                auVar41._8_4_ = fVar3 * fVar103;
                auVar41._12_4_ = fVar3 * fVar104;
                auVar41._16_4_ = fVar3 * fVar105;
                auVar41._20_4_ = fVar3 * fVar106;
                auVar41._24_4_ = fVar3 * fVar107;
                auVar41._28_4_ = fVar3;
                auVar68 = vfmadd213ps_fma(auVar132,auVar99,auVar41);
                auVar68 = vfmadd213ps_fma(auVar127,auVar98,ZEXT1632(auVar68));
                auVar77 = ZEXT1632(CONCAT412(auVar68._12_4_ + auVar68._12_4_,
                                             CONCAT48(auVar68._8_4_ + auVar68._8_4_,
                                                      CONCAT44(auVar68._4_4_ + auVar68._4_4_,
                                                               auVar68._0_4_ + auVar68._0_4_))));
                auVar133._0_4_ = auVar80._0_4_ * fVar67;
                auVar133._4_4_ = auVar80._4_4_ * fVar102;
                auVar133._8_4_ = auVar80._8_4_ * fVar103;
                auVar133._12_4_ = auVar80._12_4_ * fVar104;
                auVar133._16_4_ = auVar80._16_4_ * fVar105;
                auVar133._20_4_ = auVar80._20_4_ * fVar106;
                auVar133._24_4_ = auVar80._24_4_ * fVar107;
                auVar133._28_4_ = 0;
                auVar68 = vfmadd213ps_fma(auVar76,auVar99,auVar133);
                auVar73 = vfmadd213ps_fma(auVar74,auVar98,ZEXT1632(auVar68));
                auVar74 = vrcp14ps_avx512vl(auVar77);
                auVar33._8_4_ = 0x80000000;
                auVar33._0_8_ = 0x8000000080000000;
                auVar33._12_4_ = 0x80000000;
                auVar33._16_4_ = 0x80000000;
                auVar33._20_4_ = 0x80000000;
                auVar33._24_4_ = 0x80000000;
                auVar33._28_4_ = 0x80000000;
                auVar75 = vxorps_avx512vl(auVar77,auVar33);
                auVar34._8_4_ = 0x3f800000;
                auVar34._0_8_ = 0x3f8000003f800000;
                auVar34._12_4_ = 0x3f800000;
                auVar34._16_4_ = 0x3f800000;
                auVar34._20_4_ = 0x3f800000;
                auVar34._24_4_ = 0x3f800000;
                auVar34._28_4_ = 0x3f800000;
                auVar80 = vfnmadd213ps_avx512vl(auVar74,auVar77,auVar34);
                auVar68 = vfmadd132ps_fma(auVar80,auVar74,auVar74);
                local_25a0._28_4_ = auVar74._28_4_;
                local_25a0._0_28_ =
                     ZEXT1628(CONCAT412(auVar68._12_4_ * (auVar73._12_4_ + auVar73._12_4_),
                                        CONCAT48(auVar68._8_4_ * (auVar73._8_4_ + auVar73._8_4_),
                                                 CONCAT44(auVar68._4_4_ *
                                                          (auVar73._4_4_ + auVar73._4_4_),
                                                          auVar68._0_4_ *
                                                          (auVar73._0_4_ + auVar73._0_4_)))));
                auVar111 = ZEXT3264(local_25a0);
                auVar108._4_4_ = fVar117;
                auVar108._0_4_ = fVar117;
                auVar108._8_4_ = fVar117;
                auVar108._12_4_ = fVar117;
                auVar108._16_4_ = fVar117;
                auVar108._20_4_ = fVar117;
                auVar108._24_4_ = fVar117;
                auVar108._28_4_ = fVar117;
                uVar126 = vcmpps_avx512vl(local_25a0,auVar108,2);
                uVar2 = *(undefined4 *)((long)&(local_27a0->super_RayK<1>).org.field_0 + 0xc);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar35._16_4_ = uVar2;
                auVar35._20_4_ = uVar2;
                auVar35._24_4_ = uVar2;
                auVar35._28_4_ = uVar2;
                uVar32 = vcmpps_avx512vl(local_25a0,auVar35,0xd);
                uVar31 = vcmpps_avx512vl(auVar77,auVar75,4);
                bVar45 = (byte)uVar126 & (byte)uVar32 & (byte)uVar31 & bVar45;
                if (bVar45 != 0) {
                  uVar47 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                                   ((long)&(local_27a0->super_RayK<1>).org.field_0 +
                                                   0xc),0x10),2);
                  local_2600 = &local_27a1;
                  local_25f8 = bVar45;
                  auVar74 = vsubps_avx(local_2620,auVar96);
                  auVar74 = vblendps_avx(auVar97,auVar74,0xf0);
                  auVar75 = vsubps_avx(local_2620,auVar97);
                  local_2640 = vblendps_avx(auVar96,auVar75,0xf0);
                  local_2580[0] = auVar98._0_4_ * 1.0;
                  local_2580[1] = auVar98._4_4_ * 1.0;
                  local_2580[2] = auVar98._8_4_ * 1.0;
                  local_2580[3] = auVar98._12_4_ * 1.0;
                  fStack_2570 = auVar98._16_4_ * -1.0;
                  fStack_256c = auVar98._20_4_ * -1.0;
                  fStack_2568 = auVar98._24_4_ * -1.0;
                  uStack_2564 = auVar98._28_4_;
                  local_2560[0] = auVar99._0_4_ * 1.0;
                  local_2560[1] = auVar99._4_4_ * 1.0;
                  local_2560[2] = auVar99._8_4_ * 1.0;
                  local_2560[3] = auVar99._12_4_ * 1.0;
                  fStack_2550 = auVar99._16_4_ * -1.0;
                  fStack_254c = auVar99._20_4_ * -1.0;
                  fStack_2548 = auVar99._24_4_ * -1.0;
                  uStack_2544 = auVar99._28_4_;
                  local_2540[0] = fVar67 * 1.0;
                  local_2540[1] = fVar102 * 1.0;
                  local_2540[2] = fVar103 * 1.0;
                  local_2540[3] = fVar104 * 1.0;
                  fStack_2530 = fVar105 * -1.0;
                  fStack_252c = fVar106 * -1.0;
                  fStack_2528 = fVar107 * -1.0;
                  uStack_2524 = (uint)bVar65 * auVar83._28_4_ | (uint)!bVar65 * auVar87._28_4_;
                  auVar75 = vpbroadcastd_avx512vl();
                  auVar75 = vpaddd_avx2(auVar75,_DAT_01fb7740);
                  auVar68 = vcvtsi2ss_avx512f(in_XMM27,*(ushort *)(local_2718 + 8 + local_2720) - 1)
                  ;
                  auVar121._4_12_ = ZEXT812(0) << 0x20;
                  auVar121._0_4_ = auVar68._0_4_;
                  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar121);
                  auVar68 = vfnmadd213ss_fma(auVar73,auVar68,ZEXT416(0x40000000));
                  fStack_2648 = auVar73._0_4_ * auVar68._0_4_;
                  auVar75 = vcvtdq2ps_avx(auVar75);
                  fStack_2644 = auVar75._28_4_ + auVar74._28_4_;
                  local_2660 = (local_2620._0_4_ * auVar75._0_4_ + auVar74._0_4_) * fStack_2648;
                  fStack_265c = (local_2620._4_4_ * auVar75._4_4_ + auVar74._4_4_) * fStack_2648;
                  fStack_2658 = (local_2620._8_4_ * auVar75._8_4_ + auVar74._8_4_) * fStack_2648;
                  fStack_2654 = (local_2620._12_4_ * auVar75._12_4_ + auVar74._12_4_) * fStack_2648;
                  fStack_2650 = (local_2620._16_4_ * auVar75._16_4_ + auVar74._16_4_) * fStack_2648;
                  fStack_264c = (local_2620._20_4_ * auVar75._20_4_ + auVar74._20_4_) * fStack_2648;
                  fStack_2648 = (local_2620._24_4_ * auVar75._24_4_ + auVar74._24_4_) * fStack_2648;
                  pGVar17 = (local_2710->geometries).items[local_2798].ptr;
                  if ((pGVar17->mask & uVar47) != 0) {
                    auVar74 = vpbroadcastd_avx512vl();
                    auVar74 = vpaddd_avx2(auVar74,_DAT_01fb7760);
                    auVar74 = vcvtdq2ps_avx(auVar74);
                    auVar118._0_4_ = (float)(int)(*(ushort *)(local_2718 + 10 + local_2720) - 1);
                    auVar118._4_12_ = auVar97._4_12_;
                    auVar44._12_4_ = 0;
                    auVar44._0_12_ = ZEXT812(0);
                    auVar73 = vrcp14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)auVar118._0_4_));
                    auVar68 = vfnmadd213ss_fma(auVar73,auVar118,ZEXT416(0x40000000));
                    fVar106 = auVar73._0_4_ * auVar68._0_4_;
                    auVar36._8_4_ = 0x219392ef;
                    auVar36._0_8_ = 0x219392ef219392ef;
                    auVar36._12_4_ = 0x219392ef;
                    auVar36._16_4_ = 0x219392ef;
                    auVar36._20_4_ = 0x219392ef;
                    auVar36._24_4_ = 0x219392ef;
                    auVar36._28_4_ = 0x219392ef;
                    uVar57 = vcmpps_avx512vl(local_2620,auVar36,5);
                    auVar75 = vrcp14ps_avx512vl(local_2620);
                    auVar125._8_4_ = 0x3f800000;
                    auVar125._0_8_ = 0x3f8000003f800000;
                    auVar125._12_4_ = 0x3f800000;
                    auVar125._16_4_ = 0x3f800000;
                    auVar125._20_4_ = 0x3f800000;
                    auVar125._24_4_ = 0x3f800000;
                    auVar125._28_4_ = 0x3f800000;
                    auVar68 = vfnmadd213ps_fma(local_2620,auVar75,auVar125);
                    auVar75 = vfmadd132ps_avx512vl(ZEXT1632(auVar68),auVar75,auVar75);
                    fVar117 = (float)((uint)((byte)uVar57 & 1) * auVar75._0_4_);
                    fVar3 = (float)((uint)((byte)(uVar57 >> 1) & 1) * auVar75._4_4_);
                    fVar67 = (float)((uint)((byte)(uVar57 >> 2) & 1) * auVar75._8_4_);
                    fVar102 = (float)((uint)((byte)(uVar57 >> 3) & 1) * auVar75._12_4_);
                    fVar103 = (float)((uint)((byte)(uVar57 >> 4) & 1) * auVar75._16_4_);
                    fVar104 = (float)((uint)((byte)(uVar57 >> 5) & 1) * auVar75._20_4_);
                    fVar105 = (float)((uint)((byte)(uVar57 >> 6) & 1) * auVar75._24_4_);
                    auVar42._4_4_ = fStack_265c * fVar3;
                    auVar42._0_4_ = local_2660 * fVar117;
                    auVar42._8_4_ = fStack_2658 * fVar67;
                    auVar42._12_4_ = fStack_2654 * fVar102;
                    auVar42._16_4_ = fStack_2650 * fVar103;
                    auVar42._20_4_ = fStack_264c * fVar104;
                    auVar42._24_4_ = fStack_2648 * fVar105;
                    auVar42._28_4_ = fStack_2644;
                    local_25e0 = vminps_avx(auVar42,auVar125);
                    auVar43._4_4_ =
                         (local_2620._4_4_ * auVar74._4_4_ + local_2640._4_4_) * fVar106 * fVar3;
                    auVar43._0_4_ =
                         (local_2620._0_4_ * auVar74._0_4_ + local_2640._0_4_) * fVar106 * fVar117;
                    auVar43._8_4_ =
                         (local_2620._8_4_ * auVar74._8_4_ + local_2640._8_4_) * fVar106 * fVar67;
                    auVar43._12_4_ =
                         (local_2620._12_4_ * auVar74._12_4_ + local_2640._12_4_) * fVar106 *
                         fVar102;
                    auVar43._16_4_ =
                         (local_2620._16_4_ * auVar74._16_4_ + local_2640._16_4_) * fVar106 *
                         fVar103;
                    auVar43._20_4_ =
                         (local_2620._20_4_ * auVar74._20_4_ + local_2640._20_4_) * fVar106 *
                         fVar104;
                    auVar43._24_4_ =
                         (local_2620._24_4_ * auVar74._24_4_ + local_2640._24_4_) * fVar106 *
                         fVar105;
                    auVar43._28_4_ = auVar74._28_4_ + local_2640._28_4_;
                    local_25c0 = vminps_avx(auVar43,auVar125);
                    auVar109._8_4_ = 0x7f800000;
                    auVar109._0_8_ = 0x7f8000007f800000;
                    auVar109._12_4_ = 0x7f800000;
                    auVar109._16_4_ = 0x7f800000;
                    auVar109._20_4_ = 0x7f800000;
                    auVar109._24_4_ = 0x7f800000;
                    auVar109._28_4_ = 0x7f800000;
                    auVar74 = vblendmps_avx512vl(auVar109,local_25a0);
                    auVar100._0_4_ =
                         (uint)(bVar45 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar45 & 1) * 0x7f800000
                    ;
                    bVar65 = (bool)(bVar45 >> 1 & 1);
                    auVar100._4_4_ = (uint)bVar65 * auVar74._4_4_ | (uint)!bVar65 * 0x7f800000;
                    bVar65 = (bool)(bVar45 >> 2 & 1);
                    auVar100._8_4_ = (uint)bVar65 * auVar74._8_4_ | (uint)!bVar65 * 0x7f800000;
                    bVar65 = (bool)(bVar45 >> 3 & 1);
                    auVar100._12_4_ = (uint)bVar65 * auVar74._12_4_ | (uint)!bVar65 * 0x7f800000;
                    bVar65 = (bool)(bVar45 >> 4 & 1);
                    auVar100._16_4_ = (uint)bVar65 * auVar74._16_4_ | (uint)!bVar65 * 0x7f800000;
                    bVar65 = (bool)(bVar45 >> 5 & 1);
                    auVar100._20_4_ = (uint)bVar65 * auVar74._20_4_ | (uint)!bVar65 * 0x7f800000;
                    bVar65 = (bool)(bVar45 >> 6 & 1);
                    auVar100._24_4_ = (uint)bVar65 * auVar74._24_4_ | (uint)!bVar65 * 0x7f800000;
                    auVar100._28_4_ =
                         (uint)(bVar45 >> 7) * auVar74._28_4_ |
                         (uint)!(bool)(bVar45 >> 7) * 0x7f800000;
                    auVar74 = vshufps_avx(auVar100,auVar100,0xb1);
                    auVar74 = vminps_avx(auVar100,auVar74);
                    auVar75 = vshufpd_avx(auVar74,auVar74,5);
                    auVar74 = vminps_avx(auVar74,auVar75);
                    auVar75 = vpermpd_avx2(auVar74,0x4e);
                    auVar74 = vminps_avx(auVar74,auVar75);
                    uVar126 = vcmpps_avx512vl(auVar100,auVar74,0);
                    bVar52 = bVar45;
                    if ((bVar45 & (byte)uVar126) != 0) {
                      bVar52 = bVar45 & (byte)uVar126;
                    }
                    uVar47 = 0;
                    for (uVar53 = (uint)bVar52; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x80000000
                        ) {
                      uVar47 = uVar47 + 1;
                    }
                    uVar57 = (ulong)uVar47;
                    pRVar22 = local_2780->args;
                    if ((pRVar22->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      pRVar23 = local_2780->user;
                      local_2680 = ZEXT432((uint)(local_27a0->super_RayK<1>).tfar);
                      local_26a0 = local_25a0;
                      do {
                        local_26c4 = *(undefined4 *)(local_25e0 + uVar57 * 4);
                        local_26c0 = *(undefined4 *)(local_25c0 + uVar57 * 4);
                        (ray->super_RayK<1>).tfar = local_2580[uVar57 - 8];
                        local_26d0 = local_2580[uVar57];
                        local_26cc = local_2560[uVar57];
                        local_26c8 = local_2540[uVar57];
                        local_26bc = (int)local_2778;
                        local_26b8 = (int)local_2798;
                        local_26b4 = pRVar23->instID[0];
                        local_26b0 = pRVar23->instPrimID[0];
                        local_2784 = -1;
                        local_2700.valid = &local_2784;
                        local_2700.geometryUserPtr = pGVar17->userPtr;
                        local_2700.context = pRVar23;
                        local_2700.ray = (RTCRayN *)ray;
                        local_2700.hit = (RTCHitN *)&local_26d0;
                        local_2700.N = 1;
                        if (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c83d13:
                          if ((pRVar22->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar22->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar22->filter)(&local_2700);
                            auVar111 = ZEXT3264(local_26a0);
                            ray = local_27a0;
                            if (*local_2700.valid == 0) goto LAB_01c83dad;
                          }
                          (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_2700.hit;
                          (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_2700.hit + 4);
                          (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_2700.hit + 8);
                          *(float *)((long)local_2700.ray + 0x3c) = *(float *)(local_2700.hit + 0xc)
                          ;
                          *(float *)((long)local_2700.ray + 0x40) =
                               *(float *)(local_2700.hit + 0x10);
                          *(float *)((long)local_2700.ray + 0x44) =
                               *(float *)(local_2700.hit + 0x14);
                          *(float *)((long)local_2700.ray + 0x48) =
                               *(float *)(local_2700.hit + 0x18);
                          *(float *)((long)local_2700.ray + 0x4c) =
                               *(float *)(local_2700.hit + 0x1c);
                          *(float *)((long)local_2700.ray + 0x50) =
                               *(float *)(local_2700.hit + 0x20);
                        }
                        else {
                          (*pGVar17->intersectionFilterN)(&local_2700);
                          auVar111 = ZEXT3264(local_26a0);
                          ray = local_27a0;
                          if (*local_2700.valid != 0) goto LAB_01c83d13;
LAB_01c83dad:
                          (local_27a0->super_RayK<1>).tfar = (float)local_2680._0_4_;
                          ray = local_27a0;
                        }
                        bVar45 = ~(byte)(1 << ((uint)uVar57 & 0x1f)) & bVar45;
                        fVar117 = (ray->super_RayK<1>).tfar;
                        auVar37._4_4_ = fVar117;
                        auVar37._0_4_ = fVar117;
                        auVar37._8_4_ = fVar117;
                        auVar37._12_4_ = fVar117;
                        auVar37._16_4_ = fVar117;
                        auVar37._20_4_ = fVar117;
                        auVar37._24_4_ = fVar117;
                        auVar37._28_4_ = fVar117;
                        uVar126 = vcmpps_avx512vl(auVar111._0_32_,auVar37,2);
                        if ((bVar45 & (byte)uVar126) == 0) goto LAB_01c83b52;
                        local_2680 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar45 = bVar45 & (byte)uVar126;
                        auVar110._8_4_ = 0x7f800000;
                        auVar110._0_8_ = 0x7f8000007f800000;
                        auVar110._12_4_ = 0x7f800000;
                        auVar110._16_4_ = 0x7f800000;
                        auVar110._20_4_ = 0x7f800000;
                        auVar110._24_4_ = 0x7f800000;
                        auVar110._28_4_ = 0x7f800000;
                        auVar74 = vblendmps_avx512vl(auVar110,auVar111._0_32_);
                        auVar101._0_4_ =
                             (uint)(bVar45 & 1) * auVar74._0_4_ |
                             (uint)!(bool)(bVar45 & 1) * 0x7f800000;
                        bVar65 = (bool)(bVar45 >> 1 & 1);
                        auVar101._4_4_ = (uint)bVar65 * auVar74._4_4_ | (uint)!bVar65 * 0x7f800000;
                        bVar65 = (bool)(bVar45 >> 2 & 1);
                        auVar101._8_4_ = (uint)bVar65 * auVar74._8_4_ | (uint)!bVar65 * 0x7f800000;
                        bVar65 = (bool)(bVar45 >> 3 & 1);
                        auVar101._12_4_ = (uint)bVar65 * auVar74._12_4_ | (uint)!bVar65 * 0x7f800000
                        ;
                        bVar65 = (bool)(bVar45 >> 4 & 1);
                        auVar101._16_4_ = (uint)bVar65 * auVar74._16_4_ | (uint)!bVar65 * 0x7f800000
                        ;
                        bVar65 = (bool)(bVar45 >> 5 & 1);
                        auVar101._20_4_ = (uint)bVar65 * auVar74._20_4_ | (uint)!bVar65 * 0x7f800000
                        ;
                        bVar65 = (bool)(bVar45 >> 6 & 1);
                        auVar101._24_4_ = (uint)bVar65 * auVar74._24_4_ | (uint)!bVar65 * 0x7f800000
                        ;
                        auVar101._28_4_ =
                             (uint)(bVar45 >> 7) * auVar74._28_4_ |
                             (uint)!(bool)(bVar45 >> 7) * 0x7f800000;
                        auVar74 = vshufps_avx(auVar101,auVar101,0xb1);
                        auVar74 = vminps_avx(auVar101,auVar74);
                        auVar75 = vshufpd_avx(auVar74,auVar74,5);
                        auVar74 = vminps_avx(auVar74,auVar75);
                        auVar75 = vpermpd_avx2(auVar74,0x4e);
                        auVar74 = vminps_avx(auVar74,auVar75);
                        uVar126 = vcmpps_avx512vl(auVar101,auVar74,0);
                        bVar46 = (byte)uVar126 & bVar45;
                        bVar52 = bVar45;
                        if (bVar46 != 0) {
                          bVar52 = bVar46;
                        }
                        uVar16 = 0;
                        for (uVar54 = (uint)bVar52; (uVar54 & 1) == 0;
                            uVar54 = uVar54 >> 1 | 0x80000000) {
                          uVar16 = uVar16 + 1;
                        }
                        uVar57 = (ulong)uVar16;
                      } while( true );
                    }
                    fVar117 = *(float *)(local_25e0 + uVar57 * 4);
                    fVar3 = *(float *)(local_25c0 + uVar57 * 4);
                    fVar67 = local_2580[uVar57];
                    fVar102 = local_2560[uVar57];
                    fVar103 = local_2540[uVar57];
                    (local_27a0->super_RayK<1>).tfar = local_2580[uVar57 - 8];
                    (local_27a0->Ng).field_0.field_0.x = fVar67;
                    (local_27a0->Ng).field_0.field_0.y = fVar102;
                    (local_27a0->Ng).field_0.field_0.z = fVar103;
                    local_27a0->u = fVar117;
                    local_27a0->v = fVar3;
                    local_27a0->primID = uVar54;
                    local_27a0->geomID = uVar16;
                    pRVar23 = local_2780->user;
                    local_27a0->instID[0] = pRVar23->instID[0];
                    local_27a0->instPrimID[0] = pRVar23->instPrimID[0];
                  }
                }
              }
LAB_01c83b52:
              auVar135 = ZEXT3264(local_2400);
              auVar137 = ZEXT3264(local_2420);
              auVar140 = ZEXT3264(local_2440);
              auVar143 = ZEXT3264(local_2460);
              auVar144 = ZEXT3264(local_2480);
              auVar145 = ZEXT3264(local_24a0);
              auVar146 = ZEXT3264(local_24c0);
              auVar147 = ZEXT3264(local_24e0);
              auVar148 = ZEXT3264(local_2500);
              auVar149 = ZEXT3264(local_23e0);
              uVar57 = local_2760;
              uVar50 = local_2738;
              uVar59 = local_2740;
              uVar60 = local_2748;
              uVar61 = local_2750;
              uVar62 = local_2758;
              uVar64 = local_2730;
              context = local_2780;
            }
          }
          auVar128 = ZEXT3264(local_2520);
        }
        auVar74 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
        auVar149 = ZEXT3264(auVar74);
        auVar111 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar74 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar134 = ZEXT3264(auVar74);
        auVar141 = ZEXT3264(CONCAT428(0xfffffff8,
                                      CONCAT424(0xfffffff8,
                                                CONCAT420(0xfffffff8,
                                                          CONCAT416(0xfffffff8,
                                                                    CONCAT412(0xfffffff8,
                                                                              CONCAT48(0xfffffff8,
                                                                                                                                                                              
                                                  0xfffffff8fffffff8)))))));
      }
      goto LAB_01c82bfb;
    }
  }
  return;
LAB_01c82d7d:
  auVar80 = vpshufd_avx2(auVar79,0x55);
  vpermt2q_avx512vl(auVar75,auVar80,auVar76);
  auVar77 = vpminsd_avx2(auVar79,auVar80);
  auVar80 = vpmaxsd_avx2(auVar79,auVar80);
  bVar45 = bVar45 - 1 & bVar45;
  if (bVar45 == 0) {
    auVar77 = vpermi2q_avx512vl(auVar77,auVar75,auVar76);
    uVar64 = auVar77._0_8_;
    auVar75 = vpermt2q_avx512vl(auVar75,auVar80,auVar76);
    *local_27b0 = auVar75._0_8_;
    lVar49 = 8;
    lStack_27c8 = 0x10;
    auVar83 = auVar80;
  }
  else {
    auVar83 = vpshufd_avx2(auVar79,0xaa);
    vpermt2q_avx512vl(auVar75,auVar83,auVar76);
    auVar78 = vpminsd_avx2(auVar77,auVar83);
    auVar77 = vpmaxsd_avx2(auVar77,auVar83);
    auVar83 = vpminsd_avx2(auVar80,auVar77);
    auVar80 = vpmaxsd_avx2(auVar80,auVar77);
    bVar45 = bVar45 - 1 & bVar45;
    if (bVar45 == 0) {
      auVar77 = vpermi2q_avx512vl(auVar78,auVar75,auVar76);
      uVar64 = auVar77._0_8_;
      auVar77 = vpermt2q_avx512vl(auVar75,auVar80,auVar76);
      *local_27b0 = auVar77._0_8_;
      auVar80 = vpermd_avx2(auVar80,auVar74);
      *(int *)(local_27b0 + 1) = auVar80._0_4_;
      auVar75 = vpermt2q_avx512vl(auVar75,auVar83,auVar76);
      local_27b0[2] = auVar75._0_8_;
      lStack_27c8 = 0x18;
      lVar49 = lStack_27c8;
      lStack_27c8 = 0x20;
    }
    else {
      auVar77 = vpshufd_avx2(auVar79,0xff);
      vpermt2q_avx512vl(auVar75,auVar77,auVar76);
      auVar82 = vpminsd_avx2(auVar78,auVar77);
      auVar77 = vpmaxsd_avx2(auVar78,auVar77);
      auVar78 = vpminsd_avx2(auVar83,auVar77);
      auVar77 = vpmaxsd_avx2(auVar83,auVar77);
      auVar83 = vpminsd_avx2(auVar80,auVar77);
      auVar80 = vpmaxsd_avx2(auVar80,auVar77);
      bVar45 = bVar45 - 1 & bVar45;
      if (bVar45 != 0) {
        auVar81 = valignd_avx512vl(auVar79,auVar79,3);
        auVar77 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
        auVar82 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar77,auVar82);
        auVar77 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar78 = vpermt2d_avx512vl(auVar82,auVar77,auVar78);
        auVar78 = vpermt2d_avx512vl(auVar78,auVar77,auVar83);
        auVar77 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar80 = vpermt2d_avx512vl(auVar78,auVar77,auVar80);
        auVar111 = ZEXT3264(auVar80);
        bVar52 = bVar45;
        do {
          auVar77 = auVar111._0_32_;
          auVar122._8_4_ = 1;
          auVar122._0_8_ = 0x100000001;
          auVar122._12_4_ = 1;
          auVar122._16_4_ = 1;
          auVar122._20_4_ = 1;
          auVar122._24_4_ = 1;
          auVar122._28_4_ = 1;
          auVar80 = vpermd_avx2(auVar122,auVar81);
          auVar81 = valignd_avx512vl(auVar81,auVar81,1);
          vpermt2q_avx512vl(auVar75,auVar81,auVar76);
          bVar52 = bVar52 - 1 & bVar52;
          uVar126 = vpcmpd_avx512vl(auVar80,auVar77,5);
          auVar80 = vpmaxsd_avx2(auVar80,auVar77);
          bVar46 = (byte)uVar126 << 1;
          auVar77 = valignd_avx512vl(auVar77,auVar77,7);
          bVar65 = (bool)((byte)uVar126 & 1);
          bVar24 = (bool)(bVar46 >> 2 & 1);
          bVar25 = (bool)(bVar46 >> 3 & 1);
          bVar26 = (bool)(bVar46 >> 4 & 1);
          bVar27 = (bool)(bVar46 >> 5 & 1);
          bVar28 = (bool)(bVar46 >> 6 & 1);
          auVar111 = ZEXT3264(CONCAT428((uint)(bVar46 >> 7) * auVar77._28_4_ |
                                        (uint)!(bool)(bVar46 >> 7) * auVar80._28_4_,
                                        CONCAT424((uint)bVar28 * auVar77._24_4_ |
                                                  (uint)!bVar28 * auVar80._24_4_,
                                                  CONCAT420((uint)bVar27 * auVar77._20_4_ |
                                                            (uint)!bVar27 * auVar80._20_4_,
                                                            CONCAT416((uint)bVar26 * auVar77._16_4_
                                                                      | (uint)!bVar26 *
                                                                        auVar80._16_4_,
                                                                      CONCAT412((uint)bVar25 *
                                                                                auVar77._12_4_ |
                                                                                (uint)!bVar25 *
                                                                                auVar80._12_4_,
                                                                                CONCAT48((uint)
                                                  bVar24 * auVar77._8_4_ |
                                                  (uint)!bVar24 * auVar80._8_4_,
                                                  CONCAT44((uint)bVar65 * auVar77._4_4_ |
                                                           (uint)!bVar65 * auVar80._4_4_,
                                                           auVar80._0_4_))))))));
        } while (bVar52 != 0);
        lVar49 = (ulong)(uint)POPCOUNT((uint)bVar45) + 3;
        while( true ) {
          auVar77 = auVar111._0_32_;
          auVar80 = vpermt2q_avx512vl(auVar75,auVar77,auVar76);
          uVar64 = auVar80._0_8_;
          bVar65 = lVar49 == 0;
          lVar49 = lVar49 + -1;
          if (bVar65) break;
          *local_27b0 = uVar64;
          auVar80 = vpermd_avx2(auVar77,auVar74);
          *(int *)(local_27b0 + 1) = auVar80._0_4_;
          auVar80 = valignd_avx512vl(auVar77,auVar77,1);
          auVar111 = ZEXT3264(auVar80);
          local_27b0 = local_27b0 + 2;
        }
        auVar128 = ZEXT3264(auVar128._0_32_);
        ray = local_27a0;
        goto LAB_01c82c23;
      }
      auVar77 = vpermi2q_avx512vl(auVar82,auVar75,auVar76);
      uVar64 = auVar77._0_8_;
      auVar77 = vpermt2q_avx512vl(auVar75,auVar80,auVar76);
      *local_27b0 = auVar77._0_8_;
      auVar80 = vpermd_avx2(auVar80,auVar74);
      *(int *)(local_27b0 + 1) = auVar80._0_4_;
      auVar80 = vpermt2q_avx512vl(auVar75,auVar83,auVar76);
      local_27b0[2] = auVar80._0_8_;
      auVar80 = vpermd_avx2(auVar83,auVar74);
      *(int *)(local_27b0 + 3) = auVar80._0_4_;
      auVar75 = vpermt2q_avx512vl(auVar75,auVar78,auVar76);
      local_27b0[4] = auVar75._0_8_;
      lStack_27c8 = 0x28;
      auVar128 = ZEXT3264(auVar128._0_32_);
      lVar49 = lStack_27c8;
      lStack_27c8 = 0x30;
      auVar83 = auVar78;
    }
  }
  auVar74 = vpermd_avx2(auVar83,auVar74);
  *(int *)((long)local_27b0 + lVar49) = auVar74._0_4_;
  local_27b0 = (ulong *)((long)local_27b0 + lStack_27c8);
  goto LAB_01c82c23;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }